

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

size_t doctest::anon_unknown_14::anon_unknown_33::trailingBytes(uchar c)

{
  byte in_DIL;
  logic_error *in_stack_ffffffffffffffd0;
  logic_error local_20 [24];
  size_t local_8;
  
  if ((in_DIL & 0xe0) == 0xc0) {
    local_8 = 2;
  }
  else if ((in_DIL & 0xf0) == 0xe0) {
    local_8 = 3;
  }
  else {
    if ((in_DIL & 0xf8) != 0xf0) {
      std::logic_error::logic_error
                (local_20,
                 "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]ALEX/build_O0/doctest/doctest.h:__LINE__: Internal doctest error: Invalid multibyte utf-8 start byte encountered"
                );
      throw_exception<std::logic_error>(in_stack_ffffffffffffffd0);
    }
    local_8 = 4;
  }
  return local_8;
}

Assistant:

size_t trailingBytes(unsigned char c) {
        if ((c & 0xE0) == 0xC0) {
            return 2;
        }
        if ((c & 0xF0) == 0xE0) {
            return 3;
        }
        if ((c & 0xF8) == 0xF0) {
            return 4;
        }
        DOCTEST_INTERNAL_ERROR("Invalid multibyte utf-8 start byte encountered");
    }